

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch.h
# Opt level: O0

void __thiscall
testinator::BranchScope::BranchScope(BranchScope *this,int line,char *file,char *name)

{
  bool bVar1;
  Branch *pBVar2;
  stack<testinator::Branch_*,_std::deque<testinator::Branch_*,_std::allocator<testinator::Branch_*>_>_>
  *this_00;
  Branch *local_30;
  char *local_28;
  char *name_local;
  char *file_local;
  BranchScope *pBStack_10;
  int line_local;
  BranchScope *this_local;
  
  local_28 = name;
  name_local = file;
  file_local._4_4_ = line;
  pBStack_10 = this;
  pBVar2 = Branch::currentParent();
  this->m_parent = pBVar2;
  pBVar2 = Branch::pushChild(this->m_parent,file_local._4_4_,name_local,local_28);
  this->m_child = pBVar2;
  bVar1 = Branch::canRunChild(this->m_parent);
  this->m_canRun = bVar1;
  if ((this->m_canRun & 1U) == 0) {
    Branch::setComplete(this->m_parent,false);
  }
  else {
    bVar1 = Branch::isComplete(this->m_child);
    this->m_canRun = (bool)((bVar1 ^ 0xffU) & 1);
    if ((this->m_canRun & 1U) != 0) {
      Branch::setCanRunChild(this->m_parent,false);
      this_00 = Branch::getStack();
      local_30 = this->m_child;
      ::std::
      stack<testinator::Branch_*,_std::deque<testinator::Branch_*,_std::allocator<testinator::Branch_*>_>_>
      ::push(this_00,&local_30);
      Branch::setComplete(this->m_child,true);
    }
  }
  return;
}

Assistant:

BranchScope(int line, const char* file, const char* name)
      : m_parent(Branch::currentParent())
      , m_child(m_parent.pushChild(line, file, name))
    {
      m_canRun = m_parent.canRunChild();
      if (!m_canRun)
      {
        m_parent.setComplete(false);
        return;
      }
      m_canRun = !m_child.isComplete();
      if (m_canRun)
      {
        m_parent.setCanRunChild(false);
        Branch::getStack().push(&m_child);
        m_child.setComplete(true);
      }
    }